

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
ztimer::TimerManager::TimePointValid
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,TimerManager *this,
          string *timePoint)

{
  bool bVar1;
  int iVar2;
  string sStack_58;
  regex rule;
  
  if (timePoint->_M_string_length == 0x13) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&rule,
               "^\\d{4}-((0[1-9])|(1[0-2]))-((0[1-9])|([1-2]\\d)|(3[0-1])) (([0-1]\\d)|(2[0-3]))(:[0-5]\\d){2}$"
               ,0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (timePoint,&rule,0);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::vector
                (__return_storage_ptr__,6,(allocator_type *)&sStack_58);
      std::__cxx11::string::substr((ulong)&sStack_58,(ulong)timePoint);
      iVar2 = std::__cxx11::stoi(&sStack_58,(size_t *)0x0,10);
      *(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start = iVar2;
      std::__cxx11::string::~string((string *)&sStack_58);
      std::__cxx11::string::substr((ulong)&sStack_58,(ulong)timePoint);
      iVar2 = std::__cxx11::stoi(&sStack_58,(size_t *)0x0,10);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[1] = iVar2;
      std::__cxx11::string::~string((string *)&sStack_58);
      std::__cxx11::string::substr((ulong)&sStack_58,(ulong)timePoint);
      iVar2 = std::__cxx11::stoi(&sStack_58,(size_t *)0x0,10);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[2] = iVar2;
      std::__cxx11::string::~string((string *)&sStack_58);
      std::__cxx11::string::substr((ulong)&sStack_58,(ulong)timePoint);
      iVar2 = std::__cxx11::stoi(&sStack_58,(size_t *)0x0,10);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[3] = iVar2;
      std::__cxx11::string::~string((string *)&sStack_58);
      std::__cxx11::string::substr((ulong)&sStack_58,(ulong)timePoint);
      iVar2 = std::__cxx11::stoi(&sStack_58,(size_t *)0x0,10);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[4] = iVar2;
      std::__cxx11::string::~string((string *)&sStack_58);
      std::__cxx11::string::substr((ulong)&sStack_58,(ulong)timePoint);
      iVar2 = std::__cxx11::stoi(&sStack_58,(size_t *)0x0,10);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[5] = iVar2;
      std::__cxx11::string::~string((string *)&sStack_58);
    }
    else {
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&rule);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> TimerManager::TimePointValid(const std::string& timePoint)
    {
        // 合法的系统时间点： char timePoint[20] = "xxxx-xx-xx xx:xx:xx";
        if (timePoint.size() != 19) {
            return {};
        }
        std::regex rule(
            "^\\d{4}-((0[1-9])|(1[0-2]))-((0[1-9])|([1-2]\\d)|(3[0-1])) (([0-1]\\d)|(2[0-3]))(:[0-5]\\d){2}$");
        if (regex_match(timePoint, rule) == false) {
            return {};
        }
        std::vector<int> ans(6);
        ans[0] = std::stoi(timePoint.substr(0, 4));   // year
        ans[1] = std::stoi(timePoint.substr(5, 2));   // month
        ans[2] = std::stoi(timePoint.substr(8, 2));   // day
        ans[3] = std::stoi(timePoint.substr(11, 2));  // hour
        ans[4] = std::stoi(timePoint.substr(14, 2));  // minute
        ans[5] = std::stoi(timePoint.substr(17, 2));  // second
        return ans;
    }